

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *pEVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Type *pTVar4;
  Scope *this;
  Symbol *args_1;
  Expression *pEVar5;
  TaggedUnionExpression *expr;
  Diagnostic *pDVar6;
  string_view name;
  SourceRange SVar7;
  Expression *valueExpr;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  Expression *local_48;
  SourceRange local_40;
  
  if (assignmentTarget != (Type *)0x0) {
    bVar3 = Type::isTaggedUnion(assignmentTarget);
    if (bVar3) {
      name = parsing::Token::valueText(&syntax->member);
      pTVar4 = Type::getCanonicalType(assignmentTarget);
      this = Symbol::scopeOrNull(&pTVar4->super_Symbol);
      args_1 = Scope::find(this,name);
      if (args_1 != (Symbol *)0x0) {
        local_48 = (Expression *)0x0;
        pEVar1 = syntax->expr;
        pTVar4 = DeclaredType::getType((DeclaredType *)(args_1 + 1));
        if (pEVar1 == (ExpressionSyntax *)0x0) {
          bVar3 = Type::isVoid(pTVar4);
          if (!bVar3) {
            SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            pDVar6 = ASTContext::addDiag(context,(DiagCode)0x9a0007,SVar7);
            Diagnostic::operator<<(pDVar6,args_1->name);
            goto LAB_003c7f2d;
          }
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = context;
          local_48 = Expression::bindRValue
                               ((Expression *)pTVar4,(Type *)syntax->expr,(ExpressionSyntax *)0x0,
                                (SourceRange)(auVar2 << 0x40),(ASTContext *)0x0,
                                in_stack_ffffffffffffffa8);
        }
        local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        expr = BumpAllocator::
               emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,assignmentTarget,args_1,&local_48,
                          &local_40);
        if ((local_48 != (Expression *)0x0) && (bVar3 = Expression::bad(local_48), bVar3)) {
          expr = (TaggedUnionExpression *)Expression::badExpr(compilation,&expr->super_Expression);
        }
        return &expr->super_Expression;
      }
      if (name._M_len != 0) {
        SVar7 = parsing::Token::range(&syntax->member);
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar7);
        pDVar6 = Diagnostic::operator<<(pDVar6,name);
        ast::operator<<(pDVar6,assignmentTarget);
      }
      goto LAB_003c7f2d;
    }
    bVar3 = Type::isError(assignmentTarget);
    if (bVar3) goto LAB_003c7f2d;
  }
  SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0x9b0007,SVar7);
LAB_003c7f2d:
  pEVar5 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar5;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr, {}, context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}